

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O2

bool mg::data::nxx_decompress(string_view *in,string *out)

{
  bool bVar1;
  char *pcVar2;
  undefined1 auStack_18 [8];
  Nxx header;
  
  if (in->_M_len < 0x10) {
    pcVar2 = "NXX file too small\n";
  }
  else {
    pcVar2 = in->_M_str;
    auStack_18 = *(undefined1 (*) [8])pcVar2;
    header._0_8_ = *(undefined8 *)(pcVar2 + 8);
    if ((char  [4])auStack_18._0_4_ == (char  [4])0x5843584e) {
      bVar1 = nxcx_decompress((Nxx *)auStack_18,(uint8_t *)(pcVar2 + 0x10),out);
      return bVar1;
    }
    if ((char  [4])auStack_18._0_4_ == (char  [4])0x5847584e) {
      bVar1 = nxgx_decompress((Nxx *)auStack_18,(uint8_t *)(pcVar2 + 0x10),out);
      return bVar1;
    }
    pcVar2 = "Invalid file magic\n";
  }
  fwrite(pcVar2,0x13,1,_stderr);
  return false;
}

Assistant:

bool nxx_decompress(const std::string_view &in, std::string &out) {
  // Input large enough to contain header?
  if (in.size() < sizeof(Nxx)) {
    fprintf(stderr, "NXX file too small\n");
    return false;
  }

  // Pun header
  Nxx header = *reinterpret_cast<const Nxx *>(in.data());
  header.to_host_order();

  // Check magic
  const uint8_t *data_ptr = reinterpret_cast<const uint8_t *>(&in[sizeof(Nxx)]);
  if (!strncmp(header.magic, MAGIC_NXCX, sizeof(header.magic))) {
    return nxcx_decompress(header, data_ptr, out);
  } else if (!strncmp(header.magic, MAGIC_NXGX, sizeof(header.magic))) {
    return nxgx_decompress(header, data_ptr, out);
  } else {
    fprintf(stderr, "Invalid file magic\n");
    return false;
  }
}